

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallSubdirectoryGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator
          (cmInstallSubdirectoryGenerator *this,cmMakefile *makefile,string *binaryDirectory,
          cmListFileBacktrace *backtrace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  char *__end;
  string local_98;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmListFileBacktrace local_40;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"","");
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (backtrace->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_98,&local_58,&local_78,MessageDefault,false,
             false,&local_40);
  if (local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallSubdirectoryGenerator_00a26e48;
  this->Makefile = makefile;
  paVar2 = &(this->BinaryDirectory).field_2;
  (this->BinaryDirectory)._M_dataplus._M_p = (pointer)paVar2;
  pcVar3 = (binaryDirectory->_M_dataplus)._M_p;
  paVar1 = &binaryDirectory->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&binaryDirectory->field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->BinaryDirectory).field_2 + 8) = uVar4;
  }
  else {
    (this->BinaryDirectory)._M_dataplus._M_p = pcVar3;
    (this->BinaryDirectory).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->BinaryDirectory)._M_string_length = binaryDirectory->_M_string_length;
  (binaryDirectory->_M_dataplus)._M_p = (pointer)paVar1;
  binaryDirectory->_M_string_length = 0;
  (binaryDirectory->field_2)._M_local_buf[0] = '\0';
  return;
}

Assistant:

cmInstallSubdirectoryGenerator::cmInstallSubdirectoryGenerator(
  cmMakefile* makefile, std::string binaryDirectory,
  cmListFileBacktrace backtrace)
  : cmInstallGenerator("", std::vector<std::string>(), "", MessageDefault,
                       false, false, std::move(backtrace))
  , Makefile(makefile)
  , BinaryDirectory(std::move(binaryDirectory))
{
}